

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall cppcms::form::~form(form *this)

{
  _data *p_Var1;
  bool bVar2;
  pointer ppVar3;
  ulong uVar4;
  ulong uVar5;
  
  (this->super_base_form)._vptr_base_form = (_func_int **)&PTR_render_002897c8;
  ppVar3 = (this->elements_).
           super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->elements_).
      super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      if ((ppVar3[uVar4].second == true) && (ppVar3[uVar4].first != (base_form *)0x0)) {
        (*(ppVar3[uVar4].first)->_vptr_base_form[7])();
      }
      ppVar3 = (this->elements_).
               super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar5 < (ulong)((long)(this->elements_).
                                    super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3 >> 4);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  p_Var1 = (this->d).ptr_;
  if (p_Var1 != (_data *)0x0) {
    operator_delete(p_Var1);
  }
  ppVar3 = (this->elements_).
           super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar3 != (pointer)0x0) {
    operator_delete(ppVar3);
    return;
  }
  return;
}

Assistant:

form::~form()
{
	for(unsigned i=0;i<elements_.size();i++) {
		if(elements_[i].second)
			delete elements_[i].first;
	}
}